

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O2

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateFragDepthAtReference
          (BuiltInsValidator *this,Decoration *decoration,Instruction *built_in_inst,
          Instruction *referenced_inst,Instruction *referenced_from_inst)

{
  uint32_t *puVar1;
  bool bVar2;
  StorageClass SVar3;
  _Rb_tree_node_base *p_Var4;
  set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
  *this_00;
  size_type sVar5;
  mapped_type *this_01;
  uint32_t *puVar6;
  undefined4 in_stack_fffffffffffffd58;
  _Rb_tree_color execution_model;
  undefined4 in_stack_fffffffffffffd5c;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  undefined1 local_208 [464];
  spv_result_t local_38;
  
  bVar2 = spvIsVulkanEnv(this->_->context_->target_env);
  if (bVar2) {
    SVar3 = GetStorageClass(referenced_from_inst);
    if ((SVar3 == Output) || (SVar3 == Max)) {
      for (p_Var4 = (this->execution_models_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &(this->execution_models_)._M_t._M_impl.super__Rb_tree_header
          ; p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        execution_model = p_Var4[1]._M_color;
        if (execution_model != 4) {
          ValidationState_t::diag
                    ((DiagnosticStream *)local_208,this->_,SPV_ERROR_INVALID_DATA,
                     referenced_from_inst);
          ValidationState_t::VkErrorID_abi_cxx11_(&local_288,this->_,0x1075,(char *)0x0);
          std::operator<<((ostream *)local_208,(string *)&local_288);
          spvLogStringForEnv_abi_cxx11_(&local_268,this->_->context_->target_env);
          std::operator<<((ostream *)local_208,(string *)&local_268);
          std::operator<<((ostream *)local_208,
                          " spec allows BuiltIn FragDepth to be used only with Fragment execution model. "
                         );
          goto LAB_00527281;
        }
      }
      puVar6 = (this->entry_points_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
               )._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (this->entry_points_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      do {
        if (puVar6 == puVar1) goto LAB_0052708d;
        this_00 = ValidationState_t::GetExecutionModes(this->_,*puVar6);
        if (this_00 ==
            (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
             *)0x0) break;
        local_208._0_4_ = DepthReplacing;
        sVar5 = std::
                set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                ::count(this_00,(key_type *)local_208);
        puVar6 = puVar6 + 1;
      } while (sVar5 != 0);
      ValidationState_t::diag
                ((DiagnosticStream *)local_208,this->_,SPV_ERROR_INVALID_DATA,referenced_from_inst);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_288,this->_,0x1078,(char *)0x0);
      std::operator<<((ostream *)local_208,(string *)&local_288);
      spvLogStringForEnv_abi_cxx11_(&local_268,this->_->context_->target_env);
      std::operator<<((ostream *)local_208,(string *)&local_268);
      std::operator<<((ostream *)local_208,
                      " spec requires DepthReplacing execution mode to be declared when using BuiltIn FragDepth. "
                     );
      execution_model = 0x7fffffff;
LAB_00527281:
      (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                (&local_248,this,decoration,built_in_inst,referenced_inst,referenced_from_inst,
                 execution_model);
      std::operator<<((ostream *)local_208,(string *)&local_248);
    }
    else {
      ValidationState_t::diag
                ((DiagnosticStream *)local_208,this->_,SPV_ERROR_INVALID_DATA,referenced_from_inst);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_288,this->_,0x1076,(char *)0x0);
      std::operator<<((ostream *)local_208,(string *)&local_288);
      spvLogStringForEnv_abi_cxx11_(&local_268,this->_->context_->target_env);
      std::operator<<((ostream *)local_208,(string *)&local_268);
      std::operator<<((ostream *)local_208,
                      " spec allows BuiltIn FragDepth to be only used for variables with Output storage class. "
                     );
      (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                (&local_248,this,decoration,built_in_inst,referenced_inst,referenced_from_inst,
                 ExecutionModelMax);
      std::operator<<((ostream *)local_208,(string *)&local_248);
      std::operator<<((ostream *)local_208," ");
      (anonymous_namespace)::BuiltInsValidator::GetStorageClassDesc_abi_cxx11_
                (&local_228,this,referenced_from_inst);
      std::operator<<((ostream *)local_208,(string *)&local_228);
      std::__cxx11::string::_M_dispose();
    }
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
  }
  else {
LAB_0052708d:
    local_38 = SPV_SUCCESS;
    if (this->function_id_ == 0) {
      local_228._M_dataplus._M_p._0_4_ = (referenced_from_inst->inst_).result_id;
      this_01 = std::
                map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
                ::operator[](&this->id_to_at_reference_checks_,(key_type_conflict *)&local_228);
      local_268._M_dataplus._M_p = (pointer)ValidateFragDepthAtReference;
      local_268._M_string_length = 0;
      local_248._M_dataplus._M_p = (pointer)this;
      std::
      bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
                ((type *)local_208,(offset_in_BuiltInsValidator_to_subr *)&local_268,
                 (BuiltInsValidator **)&local_248,decoration,built_in_inst,referenced_from_inst,
                 (_Placeholder<1> *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      std::function<spv_result_t(spvtools::val::Instruction_const&)>::
      function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
                ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_288,
                 (type *)local_208);
      std::__cxx11::
      list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
      ::push_back(this_01,(value_type *)&local_288);
      if ((code *)local_288.field_2._M_allocated_capacity != (code *)0x0) {
        (*(code *)local_288.field_2._M_allocated_capacity)(&local_288,&local_288,3);
      }
      std::
      _Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
      ::~_Tuple_impl((_Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                      *)(local_208 + 0x10));
      local_38 = SPV_SUCCESS;
    }
  }
  return local_38;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateFragDepthAtReference(
    const Decoration& decoration, const Instruction& built_in_inst,
    const Instruction& referenced_inst,
    const Instruction& referenced_from_inst) {
  if (spvIsVulkanEnv(_.context()->target_env)) {
    const spv::StorageClass storage_class = GetStorageClass(referenced_from_inst);
    if (storage_class != spv::StorageClass::Max &&
        storage_class != spv::StorageClass::Output) {
      return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
             << _.VkErrorID(4214) << spvLogStringForEnv(_.context()->target_env)
             << " spec allows BuiltIn FragDepth to be only used for "
                "variables with Output storage class. "
             << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                 referenced_from_inst)
             << " " << GetStorageClassDesc(referenced_from_inst);
    }

    for (const spv::ExecutionModel execution_model : execution_models_) {
      if (execution_model != spv::ExecutionModel::Fragment) {
        return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
               << _.VkErrorID(4213)
               << spvLogStringForEnv(_.context()->target_env)
               << " spec allows BuiltIn FragDepth to be used only with "
                  "Fragment execution model. "
               << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                   referenced_from_inst, execution_model);
      }
    }

    for (const uint32_t entry_point : *entry_points_) {
      // Every entry point from which this function is called needs to have
      // Execution Mode DepthReplacing.
      const auto* modes = _.GetExecutionModes(entry_point);
      if (!modes || !modes->count(spv::ExecutionMode::DepthReplacing)) {
        return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
               << _.VkErrorID(4216)
               << spvLogStringForEnv(_.context()->target_env)
               << " spec requires DepthReplacing execution mode to be "
                  "declared when using BuiltIn FragDepth. "
               << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                   referenced_from_inst);
      }
    }
  }

  if (function_id_ == 0) {
    // Propagate this rule to all dependant ids in the global scope.
    id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
        &BuiltInsValidator::ValidateFragDepthAtReference, this, decoration,
        built_in_inst, referenced_from_inst, std::placeholders::_1));
  }

  return SPV_SUCCESS;
}